

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<std::pair<const_int,_double>_> *this;
  initializer_list<std::pair<const_int,_double>_> __l;
  initializer_list<double> __l_00;
  bool bVar1;
  ostream *poVar2;
  function<int_(double)> *func_00;
  undefined1 local_188 [8];
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  keyed;
  pair<const_int,_double> local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  expectedKeyBy;
  undefined1 local_a0 [8];
  function<int_(double)> func;
  allocator<double> local_69;
  double local_68 [6];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> test;
  
  test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_68[4] = 3.0;
  local_68[2] = 2.0;
  local_68[3] = 2.3;
  local_68[0] = 1.0;
  local_68[1] = 1.2;
  local_38 = local_68;
  local_30 = 5;
  std::allocator<double>::allocator(&local_69);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l_00,&local_69);
  std::allocator<double>::~allocator(&local_69);
  std::function<int(double)>::function<main::__0,void>
            ((function<int(double)> *)local_a0,
             (anon_class_1_0_00000001 *)((long)&expectedKeyBy._M_h._M_single_bucket + 7));
  local_108 = 3;
  uStack_100 = 0x4008000000000000;
  local_118 = 2;
  uStack_110 = 0x4002666666666666;
  local_128 = 2;
  uStack_120 = 0x4000000000000000;
  local_138 = 1;
  uStack_130 = 0x3ff3333333333333;
  local_148.first = 1;
  local_148._4_4_ = 0;
  local_148.second = 1.0;
  local_f0 = &local_148;
  local_e8 = 5;
  this = (allocator<std::pair<const_int,_double>_> *)((long)&keyed._M_h._M_single_bucket + 5);
  std::allocator<std::pair<const_int,_double>_>::allocator(this);
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  func_00 = (function<int_(double)> *)0x0;
  std::
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::unordered_multimap
            ((unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)local_e0,__l,0,(hasher *)((long)&keyed._M_h._M_single_bucket + 7),
             (key_equal *)((long)&keyed._M_h._M_single_bucket + 6),this);
  std::allocator<std::pair<const_int,_double>_>::~allocator
            ((allocator<std::pair<const_int,_double>_> *)((long)&keyed._M_h._M_single_bucket + 5));
  poVar2 = std::operator<<((ostream *)&std::cout,"Test keyBy...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Functional::
  keyBy<std::vector,double,std::allocator<double>,int,std::equal_to<int>,std::hash<int>,std::allocator<std::pair<int_const,double>>>
            ((unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)local_188,(Functional *)local_28,(vector<double,_std::allocator<double>_> *)local_a0
             ,func_00);
  bVar1 = std::operator==((unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)local_e0,
                          (unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)local_188);
  if (!bVar1) {
    __assert_fail("expectedKeyBy==keyed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/keyBy/main.cpp"
                  ,0x17,"int main()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~unordered_multimap
            ((unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)local_188);
  std::
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~unordered_multimap
            ((unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)local_e0);
  std::function<int_(double)>::~function((function<int_(double)> *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main(){
   
  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< int(double) > func= [] (const double & element){return (int)element;};
  unordered_multimap<int, double> expectedKeyBy={
      make_pair(1,1.0),
      make_pair(1,1.2),
      make_pair(2,2.0),
      make_pair(2,2.3),
      make_pair(3, 3.0)      
  };
  cout << "Test keyBy..." << endl;
  auto keyed = Functional::keyBy(test,func); 
  assert( expectedKeyBy==keyed);
  cout << "passed!" << endl;
  

  return 0;

}